

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.h
# Opt level: O3

void __thiscall QNativeIpcKey::QNativeIpcKey(QNativeIpcKey *this,QNativeIpcKey *other)

{
  Data *pDVar1;
  QNativeIpcKeyPrivate *pQVar2;
  
  pQVar2 = other->d;
  this->d = pQVar2;
  pDVar1 = (other->key).d.d;
  (this->key).d.d = pDVar1;
  (this->key).d.ptr = (other->key).d.ptr;
  (this->key).d.size = (other->key).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar2 = this->d;
  }
  this->typeAndFlags = other->typeAndFlags;
  if (pQVar2 != (QNativeIpcKeyPrivate *)0x0) {
    copy_internal(this,other);
  }
  return;
}

Assistant:

QNativeIpcKey(const QNativeIpcKey &other)
        : d(other.d), key(other.key), typeAndFlags(other.typeAndFlags)
    {
        if (isSlowPath())
            copy_internal(other);
    }